

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O3

vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *
dgrminer::compute_min_code
          (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
           *__return_storage_ptr__,
          vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list)

{
  pointer *ppaVar1;
  vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *this;
  vector<int,std::allocator<int>> *this_00;
  undefined4 *puVar2;
  undefined8 uVar3;
  mapped_type mVar4;
  iterator iVar5;
  iterator __position;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  iterator __last;
  bool bVar9;
  mapped_type *pmVar10;
  pointer paVar11;
  _Map_pointer ppiVar12;
  int *piVar13;
  _Elt_pointer piVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  _Bit_type *p_Var18;
  _Elt_pointer piVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  _Bit_type *p_Var23;
  int iVar24;
  int iVar25;
  size_type __n;
  key_type *__k;
  ulong uVar26;
  _Map_pointer ppiVar27;
  pointer piVar28;
  ulong uVar29;
  _Elt_pointer piVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  array<int,_10UL> *paVar34;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  _Var35;
  ulong uVar36;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  array<int,_10UL> newedge;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  array<int,_10UL> built_min_code_edge;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  vector<int,_std::allocator<int>_> selected_candidates;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> starting_edges;
  __normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
  local_2f8;
  iterator iStack_2f0;
  labeled_pattern_edge *local_2e8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_2e0;
  long local_2d8;
  int local_2cc;
  _Deque_base<int,_std::allocator<int>_> local_2c8;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> local_278;
  size_type local_260;
  vector<bool,_std::allocator<bool>_> local_258;
  ulong local_230;
  void *local_228;
  iterator iStack_220;
  int *local_218;
  void *local_208;
  iterator iStack_200;
  int *local_1f8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1e8;
  labeled_pattern_edge local_1cc;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_1a0;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  local_170;
  _Deque_base<int,_std::allocator<int>_> local_158;
  array<int,_10UL> local_100;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_d8;
  size_type local_a8;
  int *local_a0;
  int *local_98;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8 = ((long)(edge_list->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(edge_list->
                     super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_2e0 = __return_storage_ptr__;
  if (0 < (int)(uint)local_2d8) {
    uVar36 = (ulong)((uint)local_2d8 & 0x7fffffff);
    lVar32 = 0x24;
    do {
      paVar11 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar3 = *(undefined8 *)((long)paVar11->_M_elems + lVar32 + -0x24);
      local_2c8._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)CONCAT44((int)uVar3,(int)((ulong)uVar3 >> 0x20));
      local_2c8._M_impl.super__Deque_impl_data._M_map_size =
           *(size_t *)((long)paVar11->_M_elems + lVar32 + -8);
      iVar15 = *(int *)((long)paVar11->_M_elems + lVar32 + -0x14);
      if (iVar15 == 1) {
        iVar15 = 2;
      }
      else if (iVar15 == 2) {
        iVar15 = 1;
      }
      uVar3 = *(undefined8 *)((long)paVar11->_M_elems + lVar32 + -0x1c);
      puVar2 = (undefined4 *)((long)paVar11->_M_elems + lVar32 + -0x10);
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_ = puVar2[1];
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_ = (undefined4)uVar3;
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_ =
           (undefined4)((ulong)uVar3 >> 0x20);
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)CONCAT44(*puVar2,iVar15);
      local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_ =
           *(undefined4 *)((long)paVar11->_M_elems + lVar32);
      iVar5._M_current =
           (edge_list->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (edge_list->
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
                   iVar5,(array<int,_10UL> *)&local_2c8);
      }
      else {
        *(ulong *)((iVar5._M_current)->_M_elems + 8) =
             CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                      local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
        *(_Elt_pointer *)((iVar5._M_current)->_M_elems + 4) =
             local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur;
        *(ulong *)((iVar5._M_current)->_M_elems + 6) =
             CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                      local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_);
        *(_Map_pointer *)(iVar5._M_current)->_M_elems =
             local_2c8._M_impl.super__Deque_impl_data._M_map;
        *(size_t *)((iVar5._M_current)->_M_elems + 2) =
             local_2c8._M_impl.super__Deque_impl_data._M_map_size;
        ppaVar1 = &(edge_list->
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppaVar1 = *ppaVar1 + 1;
      }
      lVar32 = lVar32 + 0x28;
      uVar36 = uVar36 - 1;
    } while (uVar36 != 0);
  }
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  find_minimum_labelings(&local_60,edge_list,&local_48,true);
  local_a0 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar15 = (int)local_2d8 * 2;
    local_a8 = (size_type)iVar15;
    __n = (size_type)(int)local_2d8;
    local_230 = 0x800000000000003f;
    piVar28 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    lVar32 = local_2d8;
    local_260 = __n;
    do {
      iVar24 = *piVar28;
      local_100._M_elems[0] = 0;
      local_100._M_elems[1] = 1;
      uVar36 = (ulong)iVar24;
      paVar11 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_100._M_elems[2] = paVar11[uVar36]._M_elems[2];
      local_100._M_elems[3] = paVar11[uVar36]._M_elems[3];
      local_100._M_elems[4] = paVar11[uVar36]._M_elems[4];
      local_100._M_elems[5] = paVar11[uVar36]._M_elems[5];
      local_100._M_elems[6] = paVar11[uVar36]._M_elems[6];
      local_100._M_elems[7] = paVar11[uVar36]._M_elems[7];
      local_100._M_elems[8] = paVar11[uVar36]._M_elems[8];
      local_100._M_elems[9] = paVar11[uVar36]._M_elems[9];
      paVar34 = (local_2e0->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_98 = piVar28;
      if (((local_2e0->
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish == paVar34) ||
         (bVar9 = is_pattern_edge_smaller_than(paVar34,&local_100,true), !bVar9)) {
        local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (array<int,_10UL> *)0x0;
        local_278.super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<int,_10UL> *)0x0;
        std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
        _M_realloc_insert<std::array<int,10ul>const&>
                  ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)&local_278,
                   (iterator)0x0,&local_100);
        local_2c8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2c8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_258,local_a8,(bool *)&local_2c8,(allocator_type *)&local_158);
        local_2c8._M_impl.super__Deque_impl_data._M_map._0_4_ = 0xffffffff;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_90,__n,(value_type_conflict1 *)&local_2c8,(allocator_type *)&local_158);
        local_2c8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)((ulong)local_2c8._M_impl.super__Deque_impl_data._M_map._4_4_ << 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_78,__n,(value_type_conflict1 *)&local_2c8,(allocator_type *)&local_158);
        local_2c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2c8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::vector(&local_170,__n,(value_type *)&local_2c8,(allocator_type *)&local_158);
        if (local_2c8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2c8._M_impl.super__Deque_impl_data._M_map);
        }
        local_2c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
        local_2c8._M_impl.super__Deque_impl_data._M_map_size = 0;
        local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector(&local_1e8,__n,(value_type *)&local_2c8,(allocator_type *)&local_158);
        if (local_2c8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
          operator_delete(local_2c8._M_impl.super__Deque_impl_data._M_map);
        }
        *local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = iVar24;
        iVar20 = iVar24 + 0x3f;
        if (-1 < iVar24) {
          iVar20 = iVar24;
        }
        local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar20 >> 6) + ((ulong)((uVar36 & local_230) < 0x8000000000000001) - 1)] =
             local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar20 >> 6) + ((ulong)((uVar36 & local_230) < 0x8000000000000001) - 1)] |
             1L << ((byte)iVar24 & 0x3f);
        lVar32 = (long)((int)lVar32 + iVar24) % (long)iVar15;
        iVar20 = (int)lVar32;
        iVar24 = iVar20 + 0x3f;
        if (-1 < iVar20) {
          iVar24 = iVar20;
        }
        local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar24 >> 6) + ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] =
             local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar24 >> 6) + ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)]
             | 1L << ((byte)lVar32 & 0x3f);
        local_1f8 = (int *)0x0;
        local_208 = (void *)0x0;
        iStack_200._M_current = (int *)0x0;
        local_218 = (int *)0x0;
        local_228 = (void *)0x0;
        iStack_220._M_current = (int *)0x0;
        local_1a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1a0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1a0._M_impl.super__Rb_tree_header._M_header;
        local_1a0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d8._M_impl.super__Rb_tree_header._M_header;
        local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        mVar4 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar36]._M_elems[0];
        local_2c8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)
             ((ulong)local_2c8._M_impl.super__Deque_impl_data._M_map & 0xffffffff00000000);
        local_1a0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_d8,(key_type *)&local_2c8);
        *pmVar10 = mVar4;
        mVar4 = (edge_list->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar36]._M_elems[1];
        local_2c8._M_impl.super__Deque_impl_data._M_map =
             (_Map_pointer)CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_map._4_4_,1);
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_d8,(key_type *)&local_2c8);
        __n = local_260;
        *pmVar10 = mVar4;
        paVar11 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar11) {
          lVar32 = 4;
          uVar33 = 0;
          do {
            piVar13 = (int *)((long)paVar11->_M_elems + lVar32 + -4);
            if (iStack_200._M_current == local_1f8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_208,iStack_200,piVar13);
              paVar11 = (edge_list->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *iStack_200._M_current = *piVar13;
              iStack_200._M_current = iStack_200._M_current + 1;
            }
            piVar13 = (int *)((long)paVar11->_M_elems + lVar32);
            if (iStack_220._M_current == local_218) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_228,iStack_220,piVar13);
              paVar11 = (edge_list->
                        super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *iStack_220._M_current = *piVar13;
              iStack_220._M_current = iStack_220._M_current + 1;
            }
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,(key_type *)((long)paVar11->_M_elems + lVar32 + -4));
            *pmVar10 = 0;
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,
                                 (key_type *)
                                 ((long)((edge_list->
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar32));
            *pmVar10 = 0;
            uVar33 = uVar33 + 1;
            paVar11 = (edge_list->
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = ((long)(edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 3) *
                     -0x3333333333333333;
            lVar32 = lVar32 + 0x28;
          } while (uVar33 <= uVar17 && uVar17 - uVar33 != 0);
        }
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_1a0,paVar11[uVar36]._M_elems);
        *pmVar10 = 1;
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_1a0,
                             (edge_list->
                             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar36]._M_elems + 1);
        *pmVar10 = 1;
        iVar24 = 1;
        while( true ) {
          lVar32 = local_2d8;
          if ((int)local_2d8 <= iVar24) {
            if ((local_2e0->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish ==
                (local_2e0->
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
                _M_impl.super__Vector_impl_data._M_start) {
              std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::operator=
                        (local_2e0,&local_278);
            }
            else {
              bVar9 = is_code_smaller_than(&local_278,local_2e0,true);
              if (bVar9) {
                std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::
                operator=(local_2e0,&local_278);
              }
            }
            iVar24 = iVar24 + -1;
          }
          if (iVar24 == 0) break;
          iVar20 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar24];
          local_2cc = iVar24;
          if (iVar20 == 0) {
            find_rightmost_path((deque<int,_std::allocator<int>_> *)&local_2c8,&local_278);
            local_158._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = (mapped_type *)0x0;
            local_158._M_impl.super__Deque_impl_data._M_finish._M_first = (mapped_type *)0x0;
            local_158._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
            local_158._M_impl.super__Deque_impl_data._M_map_size = 0;
            std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_158,0);
            lVar32 = 0;
            uVar36 = 0;
            while( true ) {
              uVar33 = (ulong)((long)local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node -
                              (long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3;
              lVar31 = CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_);
              lVar22 = (lVar31 - (long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur >> 2
                       ) + ((long)local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first >> 2);
              if (((uVar33 - 1) +
                  (ulong)(local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                         (_Map_pointer)0x0)) * 0x80 + lVar22 <= uVar36) break;
              uVar33 = ((long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur -
                        CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_,
                                 local_2c8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_)
                       >> 2) + uVar36;
              if ((long)uVar33 < 0) {
                uVar17 = (long)uVar33 >> 7;
LAB_0011f383:
                __k = local_2c8._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                      uVar33 + uVar17 * -0x80;
              }
              else {
                if (0x7f < uVar33) {
                  uVar17 = uVar33 >> 7;
                  goto LAB_0011f383;
                }
                __k = (key_type *)
                      ((long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur + lVar32);
              }
              pmVar10 = std::
                        map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                        operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                    *)&local_d8,__k);
              if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_158._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_158,pmVar10);
              }
              else {
                *local_158._M_impl.super__Deque_impl_data._M_finish._M_cur = *pmVar10;
                local_158._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_158._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
              uVar36 = uVar36 + 1;
              lVar32 = lVar32 + 4;
            }
            piVar14 = local_158._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_158._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_158._M_impl.super__Deque_impl_data._M_finish._M_first) {
              piVar14 = local_158._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
            }
            iVar20 = piVar14[-1];
            local_2f8._M_current = (labeled_pattern_edge *)0x0;
            iStack_2f0._M_current = (labeled_pattern_edge *)0x0;
            local_2e8 = (labeled_pattern_edge *)0x0;
            lVar22 = ((uVar33 - 1) +
                     (ulong)(local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node ==
                            (_Map_pointer)0x0)) * 0x80 + lVar22;
            if (lVar22 != 1) {
              uVar36 = 0;
              ppiVar12 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_node;
              ppiVar27 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node;
              piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur;
              piVar19 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
              piVar30 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first;
              do {
                uVar33 = ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_158._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar36;
                if ((long)uVar33 < 0) {
                  uVar17 = (long)uVar33 >> 7;
LAB_0011f480:
                  piVar13 = local_158._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                            uVar33 + uVar17 * -0x80;
                }
                else {
                  if (0x7f < uVar33) {
                    uVar17 = uVar33 >> 7;
                    goto LAB_0011f480;
                  }
                  piVar13 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur + uVar36;
                }
                uVar33 = (ulong)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset;
                if (((long)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    uVar33 != 0) {
                  iVar21 = *piVar13;
                  lVar32 = 6;
                  uVar17 = 0;
                  p_Var18 = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  p_Var23 = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                  do {
                    iVar25 = (int)uVar17;
                    if ((((p_Var18[uVar17 >> 6 & 0x3ffffff] >> (uVar17 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar17 * 4) == iVar20)) &&
                       (*(int *)((long)local_228 + uVar17 * 4) == iVar21)) {
                      piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      uVar26 = ((long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2c8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar36;
                      if ((long)uVar26 < 0) {
                        uVar29 = (long)uVar26 >> 7;
LAB_0011f553:
                        piVar13 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_node[uVar29]
                                  + uVar26 + uVar29 * -0x80;
                      }
                      else {
                        if (0x7f < uVar26) {
                          uVar29 = uVar26 >> 7;
                          goto LAB_0011f553;
                        }
                        piVar13 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar36;
                      }
                      local_1cc.elements._M_elems[0] = piVar14[-1];
                      local_1cc.elements._M_elems[1] = *piVar13;
                      paVar11 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar13 = paVar11->_M_elems + lVar32 + -4;
                      local_1cc.elements._M_elems._8_8_ = *(undefined8 *)piVar13;
                      local_1cc.elements._M_elems._16_8_ = *(undefined8 *)(piVar13 + 2);
                      piVar13 = paVar11->_M_elems + lVar32;
                      uVar3 = *(undefined8 *)piVar13;
                      uVar7 = *(undefined8 *)(piVar13 + 2);
                      local_1cc.elements._M_elems[6] = (int)uVar3;
                      local_1cc.elements._M_elems[7] = (int)((ulong)uVar3 >> 0x20);
                      local_1cc.elements._M_elems[8] = (int)uVar7;
                      local_1cc.elements._M_elems[9] = (int)((ulong)uVar7 >> 0x20);
                      local_1cc.index = iVar25;
                      if (iStack_2f0._M_current == local_2e8) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_2f8,iStack_2f0,&local_1cc);
                        uVar33 = (ulong)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl
                                        .super__Bvector_impl_data._M_finish.super__Bit_iterator_base
                                        ._M_offset;
                        p_Var18 = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                        p_Var23 = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                      }
                      else {
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1cc.elements._M_elems[8],local_1cc.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 9) =
                             CONCAT44(iVar25,local_1cc.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 4) =
                             local_1cc.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 6) = uVar3;
                        *(ulong *)((iStack_2f0._M_current)->elements)._M_elems =
                             CONCAT44(local_1cc.elements._M_elems[1],local_1cc.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 2) =
                             local_1cc.elements._M_elems._8_8_;
                        iStack_2f0._M_current = iStack_2f0._M_current + 1;
                      }
                    }
                    uVar17 = uVar17 + 1;
                    lVar32 = lVar32 + 10;
                  } while (uVar17 < uVar33 + ((long)p_Var23 - (long)p_Var18) * 8);
                  lVar31 = CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,
                                    local_2c8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_)
                  ;
                  ppiVar12 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_node;
                  __n = local_260;
                  ppiVar27 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node;
                  piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur;
                  piVar19 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  piVar30 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first;
                }
                uVar36 = uVar36 + 1;
                lVar22 = ((long)piVar19 - (long)piVar30 >> 2) +
                         ((((ulong)((long)ppiVar27 - (long)ppiVar12) >> 3) - 1) +
                         (ulong)(ppiVar27 == (_Map_pointer)0x0)) * 0x80;
                lVar32 = lVar31 - (long)piVar14 >> 2;
              } while (uVar36 < (lVar32 + lVar22) - 1U);
              lVar22 = lVar22 + lVar32;
            }
            uVar16 = (int)lVar22 - 1;
            if (-1 < (int)uVar16) {
              uVar36 = (ulong)uVar16;
              do {
                uVar33 = ((long)local_158._M_impl.super__Deque_impl_data._M_start._M_cur -
                          (long)local_158._M_impl.super__Deque_impl_data._M_start._M_first >> 2) +
                         uVar36;
                if ((long)uVar33 < 0) {
                  uVar17 = (long)uVar33 >> 7;
LAB_0011f6db:
                  piVar13 = local_158._M_impl.super__Deque_impl_data._M_start._M_node[uVar17] +
                            uVar33 + uVar17 * -0x80;
                }
                else {
                  if (0x7f < uVar33) {
                    uVar17 = uVar33 >> 7;
                    goto LAB_0011f6db;
                  }
                  piVar13 = local_158._M_impl.super__Deque_impl_data._M_start._M_cur + uVar36;
                }
                if (((long)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                    (ulong)local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset !=
                    0) {
                  iVar20 = *piVar13;
                  uVar33 = 0;
                  do {
                    iVar21 = (int)uVar33;
                    if ((((local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar33 >> 6 & 0x3ffffff] >> (uVar33 & 0x3f) & 1) == 0) &&
                        (*(int *)((long)local_208 + uVar33 * 4) == iVar20)) &&
                       (pmVar10 = std::
                                  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                                *)&local_1a0,
                                               (key_type *)(uVar33 * 4 + (long)local_228)),
                       *pmVar10 == 0)) {
                      uVar17 = ((long)local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur -
                                CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_start._M_first.
                                         _4_4_,local_2c8._M_impl.super__Deque_impl_data._M_start.
                                               _M_first._0_4_) >> 2) + uVar36;
                      if ((long)uVar17 < 0) {
                        uVar26 = (long)uVar17 >> 7;
LAB_0011f797:
                        piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_node[uVar26]
                                  + uVar17 + uVar26 * -0x80;
                      }
                      else {
                        if (0x7f < uVar17) {
                          uVar26 = uVar17 >> 7;
                          goto LAB_0011f797;
                        }
                        piVar14 = local_2c8._M_impl.super__Deque_impl_data._M_start._M_cur + uVar36;
                      }
                      piVar19 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
                      if (local_2c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                          local_2c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
                        piVar19 = local_2c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] +
                                  0x80;
                      }
                      local_1cc.elements._M_elems[0] = *piVar14;
                      local_1cc.elements._M_elems[1] = piVar19[-1] + 1;
                      paVar11 = (edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      piVar13 = paVar11[uVar33]._M_elems + 2;
                      local_1cc.elements._M_elems._8_8_ = *(undefined8 *)piVar13;
                      local_1cc.elements._M_elems._16_8_ = *(undefined8 *)(piVar13 + 2);
                      piVar13 = paVar11[uVar33]._M_elems + 6;
                      uVar3 = *(undefined8 *)piVar13;
                      uVar7 = *(undefined8 *)(piVar13 + 2);
                      local_1cc.elements._M_elems[6] = (int)uVar3;
                      local_1cc.elements._M_elems[7] = (int)((ulong)uVar3 >> 0x20);
                      local_1cc.elements._M_elems[8] = (int)uVar7;
                      local_1cc.elements._M_elems[9] = (int)((ulong)uVar7 >> 0x20);
                      local_1cc.index = iVar21;
                      if (iStack_2f0._M_current == local_2e8) {
                        std::
                        vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                        ::_M_realloc_insert<dgrminer::labeled_pattern_edge_const&>
                                  ((vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>
                                    *)&local_2f8,iStack_2f0,&local_1cc);
                      }
                      else {
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 7) =
                             CONCAT44(local_1cc.elements._M_elems[8],local_1cc.elements._M_elems[7])
                        ;
                        *(ulong *)(((iStack_2f0._M_current)->elements)._M_elems + 9) =
                             CONCAT44(iVar21,local_1cc.elements._M_elems[9]);
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 4) =
                             local_1cc.elements._M_elems._16_8_;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 6) = uVar3;
                        *(ulong *)((iStack_2f0._M_current)->elements)._M_elems =
                             CONCAT44(local_1cc.elements._M_elems[1],local_1cc.elements._M_elems[0])
                        ;
                        *(undefined8 *)(((iStack_2f0._M_current)->elements)._M_elems + 2) =
                             local_1cc.elements._M_elems._8_8_;
                        iStack_2f0._M_current = iStack_2f0._M_current + 1;
                      }
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < (ulong)local_258.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                    ((long)local_258.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_p -
                                    (long)local_258.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_start.
                                          super__Bit_iterator_base._M_p) * 8);
                }
                bVar9 = 0 < (long)uVar36;
                uVar36 = uVar36 - 1;
              } while (bVar9);
            }
            __last._M_current = iStack_2f0._M_current;
            _Var35._M_current = local_2f8._M_current;
            if (local_2f8._M_current != iStack_2f0._M_current) {
              uVar36 = ((long)iStack_2f0._M_current - (long)local_2f8._M_current >> 2) *
                       0x2e8ba2e8ba2e8ba3;
              lVar32 = 0x3f;
              if (uVar36 != 0) {
                for (; uVar36 >> lVar32 == 0; lVar32 = lVar32 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (local_2f8,
                         (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                          )iStack_2f0._M_current,(ulong)(((uint)lVar32 ^ 0x3f) * 2) ^ 0x7e,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x120365);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                        (_Var35,(__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                                 )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                          )0x120365);
            }
            paVar11 = local_170.
                      super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar24].
                      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_170.
                super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar24].
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish != paVar11) {
              local_170.
              super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar24].
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = paVar11;
            }
            piVar28 = local_1e8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar24].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
            if (local_1e8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar24].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish != piVar28) {
              local_1e8.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar24].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = piVar28;
            }
            _Var35._M_current = local_2f8._M_current;
            if (iStack_2f0._M_current != local_2f8._M_current) {
              lVar32 = 0;
              uVar36 = 0;
              do {
                _Var35._M_current = local_2f8._M_current;
                if ((uVar36 != 0) &&
                   (bVar9 = is_pattern_edge_smaller_than
                                      ((array<int,_10UL> *)
                                       ((long)local_2f8._M_current[-1].elements._M_elems + lVar32),
                                       (array<int,_10UL> *)
                                       ((long)((local_2f8._M_current)->elements)._M_elems + lVar32),
                                       true), bVar9)) break;
                this = (vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                       (local_170.
                        super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar24);
                paVar34 = (array<int,_10UL> *)
                          ((long)((_Var35._M_current)->elements)._M_elems + lVar32);
                iVar5._M_current = *(array<int,_10UL> **)(this + 8);
                if (iVar5._M_current == *(array<int,_10UL> **)(this + 0x10)) {
                  std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
                  _M_realloc_insert<std::array<int,10ul>const&>(this,iVar5,paVar34);
                }
                else {
                  *(undefined8 *)((iVar5._M_current)->_M_elems + 8) =
                       *(undefined8 *)(paVar34->_M_elems + 8);
                  uVar3 = *(undefined8 *)paVar34->_M_elems;
                  uVar7 = *(undefined8 *)(paVar34->_M_elems + 2);
                  uVar8 = *(undefined8 *)(paVar34->_M_elems + 6);
                  *(undefined8 *)((iVar5._M_current)->_M_elems + 4) =
                       *(undefined8 *)(paVar34->_M_elems + 4);
                  *(undefined8 *)((iVar5._M_current)->_M_elems + 6) = uVar8;
                  *(undefined8 *)(iVar5._M_current)->_M_elems = uVar3;
                  *(undefined8 *)((iVar5._M_current)->_M_elems + 2) = uVar7;
                  *(long *)(this + 8) = *(long *)(this + 8) + 0x28;
                }
                this_00 = (vector<int,std::allocator<int>> *)
                          (local_1e8.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar24);
                piVar13 = (int *)((long)(&(local_2f8._M_current)->elements + 1) + lVar32);
                __position._M_current = *(int **)(this_00 + 8);
                if (__position._M_current == *(int **)(this_00 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (this_00,__position,piVar13);
                }
                else {
                  *__position._M_current = *piVar13;
                  *(int **)(this_00 + 8) = __position._M_current + 1;
                }
                uVar36 = uVar36 + 1;
                lVar32 = lVar32 + 0x2c;
                _Var35._M_current = local_2f8._M_current;
              } while (uVar36 < (ulong)(((long)iStack_2f0._M_current - (long)local_2f8._M_current >>
                                        2) * 0x2e8ba2e8ba2e8ba3));
            }
            if (_Var35._M_current != (labeled_pattern_edge *)0x0) {
              operator_delete(_Var35._M_current);
            }
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_158);
            std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_2c8);
            iVar20 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar24];
          }
          uVar36 = (ulong)iVar20;
          paVar11 = local_170.
                    super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar24].
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar33 = ((long)local_170.
                          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar24].
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 3) *
                   -0x3333333333333333;
          if (uVar33 < uVar36 || uVar33 - uVar36 == 0) {
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar24] = 0;
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_278.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
            local_2c8._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_2c8._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar10);
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_278.
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
            local_158._M_impl.super__Deque_impl_data._M_map =
                 (_Map_pointer)
                 CONCAT44(local_158._M_impl.super__Deque_impl_data._M_map._4_4_,*pmVar10);
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,(key_type *)&local_2c8);
            *pmVar10 = *pmVar10 + -1;
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,(key_type *)&local_158);
            *pmVar10 = *pmVar10 + -1;
            local_278.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_278.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1;
            iVar20 = local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar24];
            if ((long)iVar20 != 0xffffffffffffffff) {
              iVar21 = iVar20 + 0x3f;
              if (-1 < iVar20) {
                iVar21 = iVar20;
              }
              bVar6 = (byte)iVar20 & 0x3f;
              local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [(long)(iVar21 >> 6) + ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)]
                   = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)(iVar21 >> 6) +
                      ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] &
                     (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              lVar32 = (long)(iVar20 + (int)local_2d8) % (long)iVar15;
              iVar21 = (int)lVar32;
              iVar20 = iVar21 + 0x3f;
              if (-1 < iVar21) {
                iVar20 = iVar21;
              }
              bVar6 = (byte)lVar32 & 0x3f;
              local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [(long)(iVar20 >> 6) + ((ulong)(((long)iVar21 & local_230) < 0x8000000000000001) - 1)]
                   = local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [(long)(iVar20 >> 6) +
                      ((ulong)(((long)iVar21 & local_230) < 0x8000000000000001) - 1)] &
                     (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar24] = -1;
            }
            iVar24 = local_2cc + -1;
          }
          else {
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar24] = iVar20 + 1;
            paVar34 = paVar11 + uVar36;
            if (local_278.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_278.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
              _M_realloc_insert<std::array<int,10ul>const&>
                        ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)
                         &local_278,
                         (iterator)
                         local_278.
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,paVar34);
            }
            else {
              *(undefined8 *)
               ((local_278.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 8) =
                   *(undefined8 *)(paVar34->_M_elems + 8);
              uVar3 = *(undefined8 *)paVar34->_M_elems;
              uVar7 = *(undefined8 *)(paVar34->_M_elems + 2);
              uVar8 = *(undefined8 *)(paVar34->_M_elems + 6);
              *(undefined8 *)
               ((local_278.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) =
                   *(undefined8 *)(paVar34->_M_elems + 4);
              *(undefined8 *)
               ((local_278.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 6) = uVar8;
              *(undefined8 *)
               (local_278.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar3;
              *(undefined8 *)
               ((local_278.
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->_M_elems + 2) = uVar7;
              local_278.
              super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_278.
                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            mVar4 = (edge_list->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [local_1e8.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar36]]._M_elems[0];
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_170.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar24].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar36]._M_elems);
            *pmVar10 = mVar4;
            mVar4 = (edge_list->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_start
                    [local_1e8.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar36]]._M_elems[1];
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_d8,
                                 local_170.
                                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar24].
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar36]._M_elems + 1);
            *pmVar10 = mVar4;
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [local_1e8.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar24].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar36]]._M_elems);
            *pmVar10 = *pmVar10 + 1;
            pmVar10 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1a0,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [local_1e8.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar24].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar36]]._M_elems + 1);
            *pmVar10 = *pmVar10 + 1;
            iVar20 = local_1e8.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar24].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[uVar36];
            local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar24] = iVar20;
            iVar24 = iVar20 + 0x3f;
            if (-1 < (long)iVar20) {
              iVar24 = iVar20;
            }
            local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(iVar24 >> 6) + ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] =
                 local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar24 >> 6) +
                  ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] |
                 1L << ((byte)iVar20 & 0x3f);
            lVar32 = (long)(iVar20 + (int)local_2d8) % (long)iVar15;
            iVar20 = (int)lVar32;
            iVar24 = iVar20 + 0x3f;
            if (-1 < iVar20) {
              iVar24 = iVar20;
            }
            local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [(long)(iVar24 >> 6) + ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] =
                 local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar24 >> 6) +
                  ((ulong)(((long)iVar20 & local_230) < 0x8000000000000001) - 1)] |
                 1L << ((byte)lVar32 & 0x3f);
            iVar24 = local_2cc + 1;
            __n = local_260;
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_d8);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_1a0);
        if (local_228 != (void *)0x0) {
          operator_delete(local_228);
        }
        if (local_208 != (void *)0x0) {
          operator_delete(local_208);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_1e8);
        std::
        vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
        ::~vector(&local_170);
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_90.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_258.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        if (local_278.
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.
                          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      piVar28 = local_98 + 1;
    } while (piVar28 != local_a0);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_2e0;
}

Assistant:

std::vector<std::array<int, 10>> compute_min_code(std::vector<std::array<int, 10>> edge_list)
    {

        //here we will eventually save the minimum code
        //at the end, we compare it with the current code and decide
        std::vector<std::array<int, 10>> minimum_code;


        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        std::vector<std::array<int, 8>> starting_edges;

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, true);

        for (int min_edge_ind : indices_of_min_edges)
        {
            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            // if we already have some min code saved, try to compare the current pattern being built
            // if the current min code is smaller, then just try another init edge
            if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[0], built_min_code_edge, true))
            {
                continue;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    // we generated a code from all edges

                    // we did not generate a smaller code,
                    // try different code (the next one may be even smaller)
                    if (minimum_code.size() == 0)
                    {
                        // just save this first code as minimum
                        minimum_code = built_min_code;
                    }
                    else
                    {
                        // compare it with the latest "minimum code" and if necessary, save the new one:
                        bool is_new_code_smaller = is_code_smaller_than(built_min_code, minimum_code, true);
                        if (is_new_code_smaller)
                        {
                            minimum_code = built_min_code;
                        }
                    }
                    // backtrack
                    current_index--;

                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {

                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};


                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }


                // try to use the candidates

                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {


                    //if (minimum_code.size() > 0 && is_pattern_edge_smaller_than(minimum_code[current_index], all_edge_candidates[current_index][edge_candidate_ind], true))
                    //{
                    //	// we should backtrack
                    //	break;
                    //}

                    //if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true))
                    //{
                    // they are same, so append it and move to other edge
                    // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                    selected_candidates[current_index] = edge_candidate_ind + 1;
                    built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                    vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                    amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                    int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                    selected_edges_ind[current_index] = sel_e_ind;
                    selected_edges[sel_e_ind] = true;
                    selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                    current_index++;
                    should_backtrack = false;
                    break;
                    //}
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return minimum_code;
    }